

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O2

void __thiscall merlin::variable_set::variable_set(variable_set *this,variable *v)

{
  allocator_type local_29;
  size_t local_28;
  
  local_28 = v->m_label;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->m_v,1,&local_28,&local_29);
  local_28 = v->m_states;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->m_dlocal,1,&local_28,&local_29);
  this->m_d = (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
  return;
}

Assistant:

variable_set(const variable& v) :
			m_v(1, v.label()), m_dlocal(1, v.states()) {
		m_d = &m_dlocal[0];
	}